

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

int compareElementRecursive
              (QCborContainerPrivate *c1,Element *e1,QCborContainerPrivate *c2,Element *e2,
              Comparison mode)

{
  char16_t *end;
  char16_t *end_00;
  Type TVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  Type TVar5;
  bool bVar6;
  Type TVar7;
  uint uVar8;
  int iVar9;
  quint64 u;
  QCborContainerPrivate *pQVar10;
  long lVar11;
  qsizetype qVar12;
  QCborContainerPrivate *pQVar13;
  size_t __n;
  QCborContainerPrivate *pQVar14;
  size_t *psVar15;
  char16_t *pcVar16;
  char *pcVar17;
  size_t *psVar18;
  storage_type_conflict *psVar19;
  size_t sVar20;
  long lVar21;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView rhs_00;
  R_conflict10 RVar22;
  R_conflict10 RVar23;
  QUtf8StringView lhs;
  QUtf8StringView lhs_00;
  char16_t *local_68;
  char16_t *src1;
  QStringView local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = e1->type;
  TVar7 = TVar1;
  if (0xffff < TVar1) {
    TVar7 = Tag;
  }
  TVar5 = e2->type;
  if (0xffff < e2->type) {
    TVar5 = Tag;
  }
  uVar8 = TVar7 - TVar5;
  if (TVar7 - TVar5 != 0) goto LAB_002b4dad;
  uVar8 = (e1->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
          super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
  uVar2 = (e2->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
          super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
  if ((uVar8 & 1) == 0) {
    if ((uVar2 & 1) == 0) {
      if (c1 == (QCborContainerPrivate *)0x0) {
        psVar18 = (size_t *)0x0;
      }
      else {
        uVar3._0_4_ = e1->type;
        uVar3._4_4_ = e1->flags;
        pcVar17 = (c1->data).d.ptr;
        if (pcVar17 == (char *)0x0) {
          pcVar17 = &QByteArray::_empty;
        }
        psVar18 = (size_t *)(pcVar17 + (e1->field_0).value);
        if ((uVar3 & 0x200000000) == 0) {
          psVar18 = (size_t *)0x0;
        }
      }
      if (c2 == (QCborContainerPrivate *)0x0) {
        psVar15 = (size_t *)0x0;
      }
      else {
        uVar4._0_4_ = e2->type;
        uVar4._4_4_ = e2->flags;
        pcVar17 = (c2->data).d.ptr;
        if (pcVar17 == (char *)0x0) {
          pcVar17 = &QByteArray::_empty;
        }
        psVar15 = (size_t *)(pcVar17 + (e2->field_0).value);
        if ((uVar4 & 0x200000000) == 0) {
          psVar15 = (size_t *)0x0;
        }
      }
      if (psVar18 == (size_t *)0x0 && psVar15 == (size_t *)0x0) {
        if ((TVar1 == Double) || (TVar1 == Tag)) {
          if ((e1->field_0).container == (e2->field_0).container) goto LAB_002b4ef5;
          uVar8 = -(uint)((e1->field_0).container < (e2->field_0).container) | 1;
        }
        else if (TVar1 == Integer) {
          pQVar10 = (e1->field_0).container;
          pQVar14 = (QCborContainerPrivate *)(0x7fffffffffffffff - (long)pQVar10);
          if (-1 < (long)pQVar10) {
            pQVar14 = pQVar10;
          }
          pQVar10 = (e2->field_0).container;
          pQVar13 = (QCborContainerPrivate *)(0x7fffffffffffffff - (long)pQVar10);
          if (-1 < (long)pQVar10) {
            pQVar13 = pQVar10;
          }
          if (pQVar14 < pQVar13) {
            uVar8 = 0xffffffff;
          }
          else {
            if (pQVar14 <= pQVar13) goto LAB_002b4ef5;
            uVar8 = 1;
          }
        }
        else {
LAB_002b4ef5:
          uVar8 = 0;
        }
      }
      else {
        if (psVar18 == (size_t *)0x0) {
          __n = 0;
        }
        else {
          __n = *psVar18;
        }
        if (psVar15 == (size_t *)0x0) {
          sVar20 = 0;
        }
        else {
          sVar20 = *psVar15;
          if ((__n != 0) && (sVar20 != 0)) {
            if ((uVar8 & 4) == 0) {
              if ((uVar2 & 4) != 0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  rhs_00.m_data = (storage_type_conflict *)(psVar15 + 1);
                  rhs_00.m_size = (long)sVar20 / 2;
                  lhs_00.m_size = *psVar18;
                  lhs_00.m_data = (storage_type *)(psVar18 + 1);
                  iVar9 = compareStringsInUtf8(lhs_00,rhs_00,mode);
                  return iVar9;
                }
                goto LAB_002b5115;
              }
              if (__n == sVar20) {
                if (mode != ForEquality) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    iVar9 = memcmp(psVar18 + 1,psVar15 + 1,__n);
                    return iVar9;
                  }
                  goto LAB_002b5115;
                }
                iVar9 = bcmp(psVar18 + 1,psVar15 + 1,__n);
                uVar8 = (uint)(iVar9 != 0);
              }
              else {
                uVar8 = (uint)((long)sVar20 <= (long)__n) * 2 - 1;
              }
            }
            else {
              psVar19 = (storage_type_conflict *)(psVar18 + 1);
              lVar11 = (long)*psVar18 / 2;
              pcVar16 = (char16_t *)(psVar15 + 1);
              if ((uVar2 & 4) == 0) {
                rhs.m_data = psVar19;
                rhs.m_size = lVar11;
                lhs.m_size = sVar20;
                lhs.m_data = (storage_type *)pcVar16;
                iVar9 = compareStringsInUtf8(lhs,rhs,mode);
                uVar8 = -iVar9;
              }
              else {
                local_58.m_size = (long)sVar20 / 2;
                local_58.m_data = pcVar16;
                local_48.m_size = lVar11;
                local_48.m_data = psVar19;
                if (mode == ForEquality) {
                  bVar6 = comparesEqual(&local_48,&local_58);
                  uVar8 = (uint)!bVar6;
                }
                else {
                  end = psVar19 + lVar11;
                  end_00 = pcVar16 + local_58.m_size;
                  lVar11 = 0;
                  lVar21 = 0;
                  local_68 = pcVar16;
                  src1 = psVar19;
                  do {
                    RVar22 = nextUtf32Character(&src1,end);
                    RVar23 = nextUtf32Character(&local_68,end_00);
                    pcVar16 = local_68;
                    lVar21 = RVar22.len + lVar21;
                    lVar11 = RVar23.len + lVar11;
                    if ((end <= src1) || (end_00 <= local_68)) break;
                  } while (RVar22.c == RVar23.c);
                  qVar12 = stringLengthInUtf8(src1,end);
                  lVar21 = qVar12 + lVar21;
                  qVar12 = stringLengthInUtf8(pcVar16,end_00);
                  lVar11 = qVar12 + lVar11;
                  uVar8 = ((lVar11 <= lVar21) - 1) + (uint)(lVar11 <= lVar21);
                  if (lVar21 == lVar11) {
                    uVar8 = RVar22.c - RVar23.c;
                  }
                }
              }
            }
            goto LAB_002b4dad;
          }
        }
        uVar8 = 0xffffffff;
        if ((long)sVar20 <= (long)__n) {
          uVar8 = (uint)(__n != sVar20);
        }
      }
LAB_002b4dad:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return uVar8;
      }
      goto LAB_002b5115;
    }
    pQVar10 = (e2->field_0).container;
    pQVar14 = (QCborContainerPrivate *)0x0;
  }
  else {
    if ((uVar2 & 1) == 0) {
      pQVar10 = (QCborContainerPrivate *)0x0;
    }
    else {
      pQVar10 = (e2->field_0).container;
    }
    pQVar14 = (e1->field_0).container;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar9 = compareContainer(pQVar14,pQVar10,mode);
    return iVar9;
  }
LAB_002b5115:
  __stack_chk_fail();
}

Assistant:

static int compareElementRecursive(const QCborContainerPrivate *c1, const Element &e1,
                                   const QCborContainerPrivate *c2, const Element &e2,
                                   Comparison mode) noexcept
{
    int cmp = typeOrder(e1.type, e2.type);
    if (cmp != 0)
        return cmp;

    if ((e1.flags & Element::IsContainer) || (e2.flags & Element::IsContainer))
        return compareContainer(e1.flags & Element::IsContainer ? e1.container : nullptr,
                                e2.flags & Element::IsContainer ? e2.container : nullptr, mode);

    // string data?
    const ByteData *b1 = c1 ? c1->byteData(e1) : nullptr;
    const ByteData *b2 = c2 ? c2->byteData(e2) : nullptr;
    if (b1 || b2) {
        auto len1 = b1 ? b1->len : 0;
        auto len2 = b2 ? b2->len : 0;
        if (len1 == 0 || len2 == 0)
            return len1 < len2 ? -1 : len1 == len2 ? 0 : 1;

        // we definitely have data from this point forward
        Q_ASSERT(b1);
        Q_ASSERT(b2);

        // Officially with CBOR, we sort first the string with the shortest
        // UTF-8 length. Since US-ASCII is just a subset of UTF-8, its length
        // is the UTF-8 length. But the UTF-16 length may not be directly
        // comparable.
        if ((e1.flags & Element::StringIsUtf16) && (e2.flags & Element::StringIsUtf16))
            return compareStringsInUtf8(b1->asStringView(), b2->asStringView(), mode);

        if (!(e1.flags & Element::StringIsUtf16) && !(e2.flags & Element::StringIsUtf16)) {
            // Neither is UTF-16, so lengths are comparable too
            // (this case includes byte arrays too)
            if (len1 == len2) {
                if (mode == Comparison::ForEquality) {
                    // GCC optimizes this to __memcmpeq(); Clang to bcmp()
                    return memcmp(b1->byte(), b2->byte(), size_t(len1)) == 0 ? 0 : 1;
                }
                return memcmp(b1->byte(), b2->byte(), size_t(len1));
            }
            return len1 < len2 ? -1 : 1;
        }

        // Only one is UTF-16
        if (e1.flags & Element::StringIsUtf16)
            return compareStringsInUtf8(b1->asStringView(), b2->asUtf8StringView(), mode);
        else
            return compareStringsInUtf8(b1->asUtf8StringView(), b2->asStringView(), mode);
    }

    return compareElementNoData(e1, e2);
}